

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O3

node_type * __thiscall
Tree<NULLC::Range>::insert(Tree<NULLC::Range> *this,node_type *node,Range *key)

{
  node_type *y;
  void *pvVar1;
  node_type *pnVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (node == (node_type *)0x0) {
    node = TypedObjectPool<detail::node<NULLC::Range>,_1024>::Allocate(&this->pool);
    pvVar1 = key->end;
    (node->key).start = key->start;
    (node->key).end = pvVar1;
  }
  else {
    if (key->end < (node->key).start) {
      pnVar2 = insert(this,node->left,key);
      node->left = pnVar2;
    }
    else {
      pnVar2 = insert(this,node->right,key);
      node->right = pnVar2;
      pnVar2 = node->left;
    }
    iVar3 = 0;
    iVar4 = 0;
    if (pnVar2 != (node_type *)0x0) {
      iVar4 = pnVar2->height;
    }
    y = node->right;
    if (y != (node_type *)0x0) {
      iVar3 = y->height;
    }
    if (iVar3 < iVar4) {
      iVar3 = iVar4;
    }
    iVar5 = 0;
    node->height = iVar3 + 1;
    iVar4 = 0;
    if (pnVar2 != (node_type *)0x0) {
      iVar4 = pnVar2->height;
    }
    if (y != (node_type *)0x0) {
      iVar5 = y->height;
    }
    if (1 < iVar4 - iVar5) {
      if ((pnVar2->key).start <= key->end) {
        if (key->start <= (pnVar2->key).end) {
          return node;
        }
        pnVar2 = left_rotate(this,pnVar2);
        node->left = pnVar2;
      }
      pnVar2 = right_rotate(this,node);
      return pnVar2;
    }
    if (iVar4 - iVar5 < -1) {
      if (key->start <= (y->key).end) {
        if ((y->key).start <= key->end) {
          return node;
        }
        pnVar2 = right_rotate(this,y);
        node->right = pnVar2;
      }
      pnVar2 = left_rotate(this,node);
      return pnVar2;
    }
  }
  return node;
}

Assistant:

node_type* insert(node_type* node, const T& key)
	{
		if(node == NULL)
		{
			node_type *t = pool.Allocate();
			t->key = key;
			return t;
		}

		if(key < node->key)
			node->left = insert(node->left, key);
		else
			node->right = insert(node->right, key);

		node->height = detail::max(get_height(node->left), get_height(node->right)) + 1;

		int balance = get_balance(node);

		if(balance > 1 && key < node->left->key)
			return right_rotate(node);

		if(balance < -1 && key > node->right->key)
			return left_rotate(node);

		if(balance > 1 && key > node->left->key)
		{
			node->left =  left_rotate(node->left);
			return right_rotate(node);
		}

		if(balance < -1 && key < node->right->key)
		{
			node->right = right_rotate(node->right);
			return left_rotate(node);
		}

		return node;
	}